

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputreader.cpp
# Opt level: O0

void __thiscall InputReader::parseFile(InputReader *this,istream *fin,InputParser *parser)

{
  byte bVar1;
  char *pcVar2;
  InputError *this_00;
  allocator local_a9;
  string local_a8 [40];
  InputError *e;
  __mbstate_t local_78;
  string local_60 [8];
  string token;
  string local_40 [8];
  string line;
  InputParser *parser_local;
  istream *fin_local;
  InputReader *this_local;
  
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  std::ios::clear(fin + *(long *)(*(long *)fin + -0x18),0);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&e,0);
  std::istream::seekg(fin,e,local_78);
  this->section = -1;
  while (this->errcount < 10) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(fin,local_40,'\n');
    bVar1 = std::ios::fail();
    if (((bVar1 & 1) != 0) && (bVar1 = std::ios::eof(), (bVar1 & 1) != 0)) break;
    trimLine(this,(string *)local_40);
    std::ios::clear(&this->sin + *(long *)(*(long *)this + -0x18),0);
    std::__cxx11::istringstream::str((string *)this);
    std::operator>>((istream *)this,local_60);
    bVar1 = std::ios::fail();
    if (((bVar1 & 1) == 0) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_60), *pcVar2 != '\0')) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
      if (*pcVar2 == '[') {
        findSection(this,(string *)local_60);
      }
      else {
        (*parser->_vptr_InputParser[2])(parser,local_40,(ulong)(uint)this->section);
      }
    }
  }
  if (this->errcount < 1) {
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
    return;
  }
  this_00 = (InputError *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"",&local_a9);
  InputError::InputError(this_00,0,(string *)local_a8);
  __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
}

Assistant:

void InputReader::parseFile(istream& fin, InputParser& parser)
{
    string line;
    string token;

    // ... reset input file

    fin.clear();
    fin.seekg(0);
    section = -1;

    // ... read each line from input file

    for (;;)
    {
        if ( errcount >= MAXERRS ) break;
        getline(fin, line, '\n');
        if (fin.fail())
        {
            if ( fin.eof() ) break;    // end of file reached - normal termination
        }

        // ... remove any comment from input line

        trimLine(line);

        // ... read 1st token from input line

        sin.clear();                   // clear string stream status flags
        sin.str(line);                 // assign input line to string stream
        sin >> token;                  // read 1st token from string stream

        // ... skip blank lines

        if ( sin.fail() || token[0] == '\0' ) continue;
        try
        {
            // ... see if at start of new input section

            if ( token[0] == '[' ) findSection(token);

            // ... otherwise parse input line of data

            else parser.parseLine(line, section);
        }
        catch (InputError& e)
        {
            errcount++;
            if ( section >= 0 )
            {
                parser.network->msgLog << e.msg << " at following line of " <<
                    sections[section] << "] section:\n";
            }
            else
            {
                parser.network->msgLog << e.msg << " at following line of file:\n";
            }
            parser.network->msgLog << line << "\n";
        }
        catch (...)
        {
            errcount++;
        }
    }

    // ... throw general input file exception if errors were found

    if ( errcount > 0 ) throw InputError(InputError::ERRORS_IN_INPUT_DATA, "");
}